

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder-helper.c
# Opt level: O0

int tlv_interest_get_header
              (uint8_t *interest,size_t buflen,interest_options_t *options,uint8_t **name,
              size_t *name_len)

{
  uint8_t *puVar1;
  uint8_t *local_48;
  uint8_t *ptr;
  uint32_t real_len;
  uint32_t real_type;
  size_t *name_len_local;
  uint8_t **name_local;
  interest_options_t *options_local;
  size_t buflen_local;
  uint8_t *interest_local;
  
  _real_len = name_len;
  name_len_local = (size_t *)name;
  name_local = (uint8_t **)options;
  options_local = (interest_options_t *)buflen;
  buflen_local = (size_t)interest;
  puVar1 = tlv_get_type_length(interest,buflen,(uint32_t *)((long)&ptr + 4),(uint32_t *)&ptr);
  if (puVar1 == (uint8_t *)0x0) {
    interest_local._4_4_ = -0xe;
  }
  else if (ptr._4_4_ == 5) {
    if ((ulong)(uint)ptr == (long)options_local - ((long)puVar1 - buflen_local)) {
      *name_len_local = (size_t)puVar1;
      local_48 = tlv_get_type_length(puVar1,(long)options_local - ((long)puVar1 - buflen_local),
                                     (uint32_t *)((long)&ptr + 4),(uint32_t *)&ptr);
      if (local_48 == (uint8_t *)0x0) {
        interest_local._4_4_ = -0xe;
      }
      else if (ptr._4_4_ == 7) {
        *_real_len = (ulong)(uint)ptr;
        local_48 = local_48 + (uint)ptr;
        if (name_local == (uint8_t **)0x0) {
          interest_local._4_4_ = 0;
        }
        else {
          *(undefined1 *)((long)name_local + 0xd) = 0;
          *(undefined1 *)((long)name_local + 0xe) = 0;
          *name_local = (uint8_t *)0xfa0;
          *(undefined1 *)((long)name_local + 0xc) = 0;
          *(undefined4 *)(name_local + 1) = 0;
          for (; local_48 < (uint8_t *)((long)&options_local->lifetime + buflen_local);
              local_48 = local_48 + (uint)ptr) {
            local_48 = tlv_get_type_length(local_48,(long)options_local -
                                                    ((long)local_48 - buflen_local),
                                           (uint32_t *)((long)&ptr + 4),(uint32_t *)&ptr);
            if (local_48 == (uint8_t *)0x0) {
              return -0xe;
            }
            if (ptr._4_4_ == 0x21) {
              *(undefined1 *)((long)name_local + 0xd) = 1;
            }
            else if (ptr._4_4_ == 0x12) {
              *(undefined1 *)((long)name_local + 0xe) = 1;
            }
            else if ((ptr._4_4_ == 0x22) && ((uint)ptr == 1)) {
              *(uint8_t *)((long)name_local + 0xc) = *local_48;
            }
            else if ((ptr._4_4_ == 10) && ((uint)ptr == 4)) {
              *(undefined4 *)(name_local + 1) = *(undefined4 *)local_48;
            }
            else if (ptr._4_4_ == 0xc) {
              puVar1 = (uint8_t *)tlv_get_uint(local_48,(ulong)(uint)ptr);
              *name_local = puVar1;
            }
          }
          interest_local._4_4_ = 0;
        }
      }
      else {
        interest_local._4_4_ = -0x11;
      }
    }
    else {
      interest_local._4_4_ = -0xd;
    }
  }
  else {
    interest_local._4_4_ = -0xc;
  }
  return interest_local._4_4_;
}

Assistant:

int
tlv_interest_get_header(uint8_t* interest,
                        size_t buflen,
                        interest_options_t* options,
                        uint8_t** name,
                        size_t* name_len)
{
  uint32_t real_type, real_len;
  uint8_t* ptr;

  ptr = tlv_get_type_length(interest, buflen, &real_type, &real_len);
  if (ptr == NULL) {
    return NDN_OVERSIZE_VAR;
  }
  if (real_type != TLV_Interest) {
    return NDN_WRONG_TLV_TYPE;
  }
  if (real_len != buflen - (ptr - interest)) {
    return NDN_WRONG_TLV_LENGTH;
  }

  // Name
  *name = ptr;
  ptr = tlv_get_type_length(ptr, buflen - (ptr - interest), &real_type, &real_len);
  if(ptr == NULL){
    return NDN_OVERSIZE_VAR;
  }
  if(real_type != TLV_Name){
    return NDN_UNSUPPORTED_FORMAT;
  }
  *name_len = real_len;
  ptr += real_len;

  // Options
  if(options == NULL){
    return NDN_SUCCESS;
  }
  options->can_be_prefix = false;
  options->must_be_fresh = false;
  options->lifetime = NDN_DEFAULT_INTEREST_LIFETIME;
  options->hop_limit = 0;
  options->nonce = 0;
  while (ptr < interest + buflen) {
    ptr = tlv_get_type_length(ptr, buflen - (ptr - interest), &real_type, &real_len);
    if(ptr == NULL){
      return NDN_OVERSIZE_VAR;
    }
    if (real_type == TLV_CanBePrefix) {
      options->can_be_prefix = true;
    }
    else if (real_type == TLV_MustBeFresh) {
      options->must_be_fresh = true;
    }
    else if (real_type == TLV_HopLimit && real_len == sizeof(options->hop_limit)) {
      options->hop_limit = *ptr;
    }
    else if (real_type == TLV_Nonce && real_len == sizeof(options->nonce)) {
      memcpy(&options->nonce, ptr, sizeof(options->nonce));
    }
    else if (real_type == TLV_InterestLifetime) {
      options->lifetime = tlv_get_uint(ptr, real_len);
    }
    ptr += real_len;
  }
  return NDN_SUCCESS;
}